

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assertions.hpp
# Opt level: O3

void rc::detail::doAssert<rc::detail::expr::Eq<rc::detail::expr::Value<unsigned_char>,char>>
               (Eq<rc::detail::expr::Value<unsigned_char>,_char> *expression,bool expectedResult,
               Type type,string *file,int line,string *assertion)

{
  CaseResult *this;
  ostringstream ss;
  string sStack_1e8;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  if (((uint)*expression->m_lexpr->m_value == (int)*expression->m_rhs) == expectedResult) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  expr::Eq<rc::detail::expr::Value<unsigned_char>,_char>::show(expression,(ostream *)local_1a8);
  this = (CaseResult *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  makeExpressionMessage(&local_1c8,file,line,assertion,&sStack_1e8);
  CaseResult::CaseResult(this,type,&local_1c8);
  __cxa_throw(this,&CaseResult::typeinfo,CaseResult::~CaseResult);
}

Assistant:

void doAssert(const Expression &expression,
              bool expectedResult,
              CaseResult::Type type,
              const std::string &file,
              int line,
              const std::string &assertion) {
  if (static_cast<bool>(expression.value()) != expectedResult) {
    std::ostringstream ss;
    expression.show(ss);
    throw CaseResult(type,
                     makeExpressionMessage(file, line, assertion, ss.str()));
  }
}